

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void line_to_examples_json<true>(vw *all,char *line,size_t num_chars,v_array<example_*> *examples)

{
  bool bVar1;
  example *this;
  example **in_RCX;
  v_array<example_*> *in_RDX;
  vw *in_RSI;
  v_array<example_*> *in_RDI;
  vw *unaff_retaddr;
  bool good_example;
  v_array<example_*> *in_stack_00000060;
  size_t in_stack_00000068;
  char *in_stack_00000070;
  vw *in_stack_00000078;
  vw *in_stack_ffffffffffffffd0;
  
  bVar1 = parse_line_json<true>
                    (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  if (bVar1) {
    prepare_for_learner(unaff_retaddr,in_RDI);
  }
  else {
    VW::return_multiple_example(in_RSI,in_RDX);
    this = VW::get_unused_example(in_stack_ffffffffffffffd0);
    v_array<example_*>::push_back((v_array<example_*> *)this,in_RCX);
  }
  return;
}

Assistant:

void line_to_examples_json(vw* all, char* line, size_t num_chars, v_array<example*>& examples)
{
  bool good_example = parse_line_json<audit>(all, line, num_chars, examples);
  if (!good_example)
  {
    VW::return_multiple_example(*all, examples);
    examples.push_back(&VW::get_unused_example(all));
    return;
  }

  prepare_for_learner(all, examples);
}